

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O1

void __thiscall MD5::print(MD5 *this)

{
  element_type *peVar1;
  long lVar2;
  Digest digest_val;
  byte local_28 [24];
  
  (*((this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_QPDFCryptoImpl[5])();
  peVar1 = (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_QPDFCryptoImpl[6])(peVar1,local_28);
  lVar2 = 0;
  do {
    printf("%02x",(ulong)local_28[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  putchar(10);
  return;
}

Assistant:

void
MD5::print()
{
    Digest digest_val;
    digest(digest_val);

    unsigned int i;
    for (i = 0; i < 16; ++i) {
        printf("%02x", digest_val[i]);
    }
    printf("\n");
}